

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O1

vector<float,_std::allocator<float>_> * __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGatherCubeCase::computeQuadTexCoord
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,TextureGatherCubeCase *this
          ,int iterationNdx)

{
  uint uVar1;
  int i_1;
  int i;
  long lVar2;
  Vec2 maxC;
  Vec2 minC;
  Vec2 local_20;
  Vec2 local_18;
  
  uVar1 = (this->super_TextureGatherCase).m_flags;
  if ((uVar1 & 2) == 0) {
    lVar2 = 0;
    do {
      local_18.m_data[lVar2] = -1.2;
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
  }
  else {
    local_18.m_data[0] = -0.6;
    local_18.m_data[1] = -1.2;
  }
  if ((uVar1 & 2) == 0) {
    lVar2 = 0;
    do {
      local_20.m_data[lVar2] = 1.2;
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
  }
  else {
    local_20.m_data[0] = 0.6;
    local_20.m_data[1] = 1.2;
  }
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  glu::TextureTestUtil::computeQuadTexCoordCube
            (__return_storage_ptr__,
             (this->m_iterations).
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration>_>
             ._M_impl.super__Vector_impl_data._M_start[iterationNdx].face,&local_18,&local_20);
  return __return_storage_ptr__;
}

Assistant:

vector<float> TextureGatherCubeCase::computeQuadTexCoord (int iterationNdx) const
{
	const bool		corners	= (m_flags & GATHERCASE_DONT_SAMPLE_CUBE_CORNERS) == 0;
	const Vec2		minC	= corners ? Vec2(-1.2f) : Vec2(-0.6f, -1.2f);
	const Vec2		maxC	= corners ? Vec2( 1.2f) : Vec2( 0.6f,  1.2f);
	vector<float>	res;
	glu::TextureTestUtil::computeQuadTexCoordCube(res, m_iterations[iterationNdx].face, minC, maxC);
	return res;
}